

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

void Extra_ThreshHeuristicTest(void)

{
  int T;
  word t;
  int Weights [16];
  word local_50;
  int local_48 [16];
  
  local_50 = 0xa888888088808880;
  T = Extra_ThreshHeuristic(&local_50,6,local_48);
  Extra_ThreshPrintWeights(T,local_48,6);
  return;
}

Assistant:

void Extra_ThreshHeuristicTest() {
    int nVars = 6;
    int T, Weights[16];

    //    word t = 19983902376700760000;
    word t = (s_Truths6[0] & s_Truths6[1] & s_Truths6[2])| (s_Truths6[0] & s_Truths6[1] & s_Truths6[3]) | (s_Truths6[0] & s_Truths6[1] & s_Truths6[4] & s_Truths6[5]) | (s_Truths6[0] & s_Truths6[2] & s_Truths6[3] & s_Truths6[4] & s_Truths6[5]);
    word * pT = &t;
    T = Extra_ThreshHeuristic(pT, nVars, Weights);
    Extra_ThreshPrintWeights(T, Weights, nVars);

}